

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

iterator llvm::skipLeadingZeroesAndAnyDot(iterator begin,iterator end,iterator *dot)

{
  long lVar1;
  
  *dot = end;
  lVar1 = (long)end - (long)begin;
  while( true ) {
    if (begin == end) {
      return end;
    }
    if (*begin != '0') break;
    begin = begin + 1;
  }
  if (*begin != '.') {
    return begin;
  }
  *dot = begin;
  if (lVar1 == 1) {
    __assert_fail("end - begin != 1 && \"Significand has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,299,
                  "StringRef::iterator llvm::skipLeadingZeroesAndAnyDot(StringRef::iterator, StringRef::iterator, StringRef::iterator *)"
                 );
  }
  do {
    begin = begin + 1;
    if (begin == end) {
      return end;
    }
  } while (*begin == '0');
  return begin;
}

Assistant:

static StringRef::iterator
skipLeadingZeroesAndAnyDot(StringRef::iterator begin, StringRef::iterator end,
                           StringRef::iterator *dot)
{
  StringRef::iterator p = begin;
  *dot = end;
  while (p != end && *p == '0')
    p++;

  if (p != end && *p == '.') {
    *dot = p++;

    assert(end - begin != 1 && "Significand has no digits");

    while (p != end && *p == '0')
      p++;
  }

  return p;
}